

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O3

ssize_t __thiscall
ritobin::io::impl_binary_read::BinaryReader::read
          (BinaryReader *this,int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  undefined4 uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->cur_;
  pcVar3 = this->cap_;
  pcVar1 = (char *)((long)&(pbVar4->_M_dataplus)._M_p + 4);
  if (pcVar1 <= pcVar3) {
    uVar2 = *(undefined4 *)&(pbVar4->_M_dataplus)._M_p;
    this->cur_ = pcVar1;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    *(undefined4 *)CONCAT44(in_register_00000034,__fd) = uVar2;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((undefined4 *)CONCAT44(in_register_00000034,__fd) + 2),&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,
                      CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                               local_38.field_2._M_local_buf[0]) + 1);
      pbVar4 = extraout_RAX;
    }
  }
  return CONCAT71((int7)((ulong)pbVar4 >> 8),pcVar1 <= pcVar3);
}

Assistant:

inline bool read(T& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            if (cur_ + sizeof(T) > cap_) {
                return false;
            }
            memcpy(&value, cur_, sizeof(T));
            cur_ += sizeof(T);
            return true;
        }